

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparatorFactory.cpp
# Opt level: O2

shared_ptr<ApprovalTests::ApprovalComparator> __thiscall
ApprovalTests::ComparatorFactory::getComparatorForFileExtensionWithDot
          (ComparatorFactory *this,string *fileExtensionWithDot)

{
  iterator iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<ApprovalTests::ApprovalComparator> sVar3;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  comparators_abi_cxx11_();
  iVar1 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ApprovalTests::ApprovalComparator>_>_>_>
          ::find(&comparators[abi:cxx11]()::allComparators_abi_cxx11_._M_t,fileExtensionWithDot);
  comparators_abi_cxx11_();
  if ((_Rb_tree_header *)iVar1._M_node ==
      &comparators[abi:cxx11]()::allComparators_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    ::std::make_shared<ApprovalTests::TextFileComparator>();
    _Var2._M_pi = a_Stack_20[0]._M_pi;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)this = local_28;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    ::std::__shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2> *)
               (iVar1._M_node + 2));
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ApprovalTests::ApprovalComparator>)
         sVar3.super___shared_ptr<ApprovalTests::ApprovalComparator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ApprovalComparator>
    ComparatorFactory::getComparatorForFileExtensionWithDot(
        const std::string& fileExtensionWithDot)
    {
        auto iterator = comparators().find(fileExtensionWithDot);
        if (iterator != comparators().end())
        {
            return iterator->second;
        }
        return std::make_shared<TextFileComparator>();
    }